

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

vector<wasm::Type,_std::allocator<wasm::Type>_> * __thiscall
wasm::TranslateToFuzzReader::recombine(wasm::Function*)::Scanner::getRelevantTypes(wasm::Type_
          (vector<wasm::Type,_std::allocator<wasm::Type>_> *__return_storage_ptr__,void *this,
          Type type)

{
  iterator __position;
  pointer pTVar1;
  pointer pTVar2;
  char cVar3;
  Nullability NVar4;
  HeapType HVar5;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *extraout_RAX;
  Type type_00;
  initializer_list<wasm::Type> __l;
  undefined1 auVar6 [16];
  Type local_60;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_58;
  pointer local_40;
  Type type_local;
  HeapType heapType;
  
  local_40 = (pointer)this;
  cVar3 = ::wasm::Type::isRef();
  if (cVar3 == '\0') {
    local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = local_40;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_58;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              (__return_storage_ptr__,__l,(allocator_type *)&type_local);
    HVar5.id = (uintptr_t)extraout_RAX;
  }
  else {
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    HVar5.id = ::wasm::Type::getHeapType();
    type_local.id = HVar5.id;
    NVar4 = ::wasm::Type::getNullability();
    if (NVar4 == NonNullable) {
      ::wasm::Type::Type(&local_60,HVar5,Nullable);
      Type_(&local_58,(void *)local_60.id,type_00);
      pTVar1 = (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      pTVar2 = (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
      super__Vector_impl_data._M_start =
           local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
      super__Vector_impl_data._M_finish =
           local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((pTVar1 != (pointer)0x0) &&
         (operator_delete(pTVar1,(long)pTVar2 - (long)pTVar1),
         local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                        .super__Vector_impl_data._M_start,
                        (long)local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    do {
      ::wasm::Type::Type((Type *)&local_58,HVar5,NVar4);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                  (__return_storage_ptr__,__position,(Type *)&local_58);
      }
      else {
        (__position._M_current)->id =
             (uintptr_t)
             local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
        (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>).
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      auVar6 = ::wasm::HeapType::getSuperType();
      HVar5.id = auVar6._0_8_;
      type_local.id = HVar5.id;
    } while ((auVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0);
  }
  return (vector<wasm::Type,_std::allocator<wasm::Type>_> *)HVar5.id;
}

Assistant:

std::vector<Type> getRelevantTypes(Type type) {
      // Given an expression of a type, we can replace not only other
      // expressions with the same type, but also supertypes - since then we'd
      // be replacing with a subtype, which is valid.
      if (!type.isRef()) {
        return {type};
      }

      std::vector<Type> ret;
      auto heapType = type.getHeapType();
      auto nullability = type.getNullability();

      if (nullability == NonNullable) {
        ret = getRelevantTypes(Type(heapType, Nullable));
      }

      while (1) {
        ret.push_back(Type(heapType, nullability));
        // TODO: handle basic supertypes too
        auto super = heapType.getSuperType();
        if (!super) {
          break;
        }
        heapType = *super;
      }

      return ret;
    }